

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

void cpu_mips_store_status_mips64el(CPUMIPSState_conflict5 *env,target_ulong val)

{
  uint uVar1;
  uint uVar2;
  CPUMIPSState_conflict5 *__mptr;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar3 = (uint)val;
  uVar5 = env->CP0_Status_rw_bitmask;
  uVar1 = env->CP0_Status;
  if ((env->insn_flags & 0x2000) != 0) {
    uVar4 = ~uVar3;
    uVar3 = uVar3 & ((((uint)(val >> 1) & 0x7fffffff | 0x80) & uVar3) >> 1 | 0xffffff9f);
    uVar2 = uVar5 & 0xffffffe7;
    if (((~uVar5 | uVar4) & 0x18) != 0) {
      uVar2 = uVar5;
    }
    uVar5 = (uVar4 | 0xffe7ffff) & uVar2;
  }
  uVar5 = (uVar3 ^ uVar1) & uVar5;
  env->CP0_Status = uVar5 ^ uVar1;
  if ((uVar5 & uVar1 & 0xe0) != 0) {
    tlb_flush_mips64el((CPUState *)(env[-3].tcs[0xc].gpr + 0x12));
  }
  if ((env->CP0_Config3 & 4) == 0) {
    compute_hflags(env);
    return;
  }
  sync_c0_status_mips64el(env,env,env->current_tc);
  return;
}

Assistant:

void cpu_mips_store_status(CPUMIPSState *env, target_ulong val)
{
    uint32_t mask = env->CP0_Status_rw_bitmask;
    target_ulong old = env->CP0_Status;

    if (env->insn_flags & ISA_MIPS32R6) {
        bool has_supervisor = extract32(mask, CP0St_KSU, 2) == 0x3;
#if defined(TARGET_MIPS64)
        uint32_t ksux = (1 << CP0St_KX) & val;
        ksux |= (ksux >> 1) & val; /* KX = 0 forces SX to be 0 */
        ksux |= (ksux >> 1) & val; /* SX = 0 forces UX to be 0 */
        val = (val & ~(7 << CP0St_UX)) | ksux;
#endif
        if (has_supervisor && extract32(val, CP0St_KSU, 2) == 0x3) {
            mask &= ~(3 << CP0St_KSU);
        }
        mask &= ~(((1 << CP0St_SR) | (1 << CP0St_NMI)) & val);
    }

    env->CP0_Status = (old & ~mask) | (val & mask);
#if defined(TARGET_MIPS64)
    if ((env->CP0_Status ^ old) & (old & (7 << CP0St_UX))) {
        /* Access to at least one of the 64-bit segments has been disabled */
        tlb_flush(env_cpu(env));
    }
#endif
    if (env->CP0_Config3 & (1 << CP0C3_MT)) {
        sync_c0_status(env, env, env->current_tc);
    } else {
        compute_hflags(env);
    }
}